

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

void envy_bios_print_info(envy_bios *bios,FILE *out,uint mask)

{
  bool bVar1;
  envy_bios_info *peVar2;
  int unk3c_st;
  int unk28_st;
  int unk19_st;
  int i;
  envy_bios_info *info;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar2 = &bios->info;
  if ((peVar2->bit != (envy_bios_bit_entry *)0x0) && ((mask & 0x10) != 0)) {
    if ((bios->info).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse BIT table \'i\' at 0x%04x version 2\n\n",
              (ulong)peVar2->bit->t_offset);
    }
    else {
      fprintf((FILE *)out,"INFO: BIOS version 0x%02x.%02x.%02x.%02x.%02x from %s for",
              (ulong)(bios->info).version[0],(ulong)(bios->info).version[1],
              (ulong)(bios->info).version[2],(ulong)(bios->info).version[3],
              (uint)(bios->info).version[4],(bios->info).date);
      if (bios->chipset == 0) {
        fprintf((FILE *)out," unknown chipset");
      }
      else {
        fprintf((FILE *)out," NV%02X",(ulong)(uint)bios->chipset);
        if (bios->chipset_name != (char *)0x0) {
          fprintf((FILE *)out," [%s]",bios->chipset_name);
        }
      }
      fprintf((FILE *)out,"\n");
      if ((bios->info).real_pcidev != 0) {
        fprintf((FILE *)out,"INFO: BR02 card, real device id 0x%04x\n",
                (ulong)(bios->info).real_pcidev);
      }
      fprintf((FILE *)out,"INFO: features");
      for (unk28_st = 0; unk28_st < 0x10; unk28_st = unk28_st + 1) {
        if (((uint)(bios->info).feature & 1 << ((byte)unk28_st & 0x1f)) != 0) {
          fprintf((FILE *)out," %s",envy_bios_print_info::featurenames[unk28_st]);
        }
      }
      if ((bios->info).feature == 0) {
        fprintf((FILE *)out," (none)");
      }
      fprintf((FILE *)out,", unk07");
      for (unk28_st = 0; unk28_st < 6; unk28_st = unk28_st + 1) {
        fprintf((FILE *)out," 0x%02x",(ulong)(bios->info).unk07[unk28_st]);
      }
      bVar1 = false;
      for (unk28_st = 0; unk28_st < 8; unk28_st = unk28_st + 1) {
        if ((bios->info).unk19[unk28_st] != '\0') {
          bVar1 = true;
        }
      }
      if (bVar1) {
        fprintf((FILE *)out,", unk19");
        for (unk28_st = 0; unk28_st < 8; unk28_st = unk28_st + 1) {
          fprintf((FILE *)out," 0x%02x",(ulong)(bios->info).unk19[unk28_st]);
        }
      }
      if ((bios->info).unk23 != '\0') {
        fprintf((FILE *)out,", unk23 0x%02x",(ulong)(bios->info).unk23);
      }
      if ((bios->info).unk24 != '\0') {
        fprintf((FILE *)out,", unk24 0x%02x",(ulong)(bios->info).unk24);
      }
      if ((bios->info).unk25 != '\0') {
        fprintf((FILE *)out,", unk25 0x%02x",(ulong)(bios->info).unk25);
      }
      if ((bios->info).unk26 != 0) {
        fprintf((FILE *)out,", unk26 0x%04x",(ulong)(bios->info).unk26);
      }
      bVar1 = false;
      for (unk28_st = 0; unk28_st < 8; unk28_st = unk28_st + 1) {
        if ((bios->info).unk28[unk28_st] != '\0') {
          bVar1 = true;
        }
      }
      if (bVar1) {
        fprintf((FILE *)out,", unk28");
        for (unk28_st = 0; unk28_st < 8; unk28_st = unk28_st + 1) {
          fprintf((FILE *)out," 0x%02x",(ulong)(bios->info).unk28[unk28_st]);
        }
      }
      if (((bios->info).unk30[0] != '\0') &&
         (fprintf((FILE *)out,", unk30 %s",(bios->info).unk30), (bios->info).unk30[3] == '\0')) {
        fprintf((FILE *)out," %s",(bios->info).unk30 + 4);
      }
      bVar1 = false;
      for (unk28_st = 0; unk28_st < 8; unk28_st = unk28_st + 1) {
        if ((bios->info).unk3c[unk28_st] != '\0') {
          bVar1 = true;
        }
      }
      if (bVar1) {
        fprintf((FILE *)out,", unk3c");
        for (unk28_st = 0; unk28_st < 8; unk28_st = unk28_st + 1) {
          fprintf((FILE *)out," 0x%02x",(ulong)(bios->info).unk3c[unk28_st]);
        }
      }
      fprintf((FILE *)out,"\n");
      envy_bios_dump_hex(bios,out,(uint)peVar2->bit->t_offset,(uint)peVar2->bit->t_len,mask);
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_info (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_info *info = &bios->info;
	if (!info->bit || !(mask & ENVY_BIOS_PRINT_INFO))
		return;
	if (!info->valid) {
		fprintf(out, "Failed to parse BIT table 'i' at 0x%04x version 2\n\n", info->bit->t_offset);
		return;
	}
	fprintf(out, "INFO: BIOS version 0x%02x.%02x.%02x.%02x.%02x from %s for", info->version[0], info->version[1], info->version[2], info->version[3], info->version[4], info->date);
	if (bios->chipset) {
		fprintf(out, " NV%02X", bios->chipset);
		if (bios->chipset_name)
			fprintf(out, " [%s]", bios->chipset_name);
	} else {
		fprintf(out, " unknown chipset");
	}
	fprintf(out, "\n");
	if (info->real_pcidev)
		fprintf(out, "INFO: BR02 card, real device id 0x%04x\n", info->real_pcidev);
	fprintf(out, "INFO: features");
	int i;
	static const char *const featurenames[16] = {
		"UNK0",
		"UNK1",
		"UNK2",
		"UNK3",
		"MOBILE",
		/* fun: these mean that FP or TV *tables* are present, not that FP or TV is present - always set on BIT BIOS. Given up on nv50+. */
		"FP",
		"TV",
		"UNK7",
		"UNK8",
		"UNK9",
		"UNK10",
		"UNK11",
		"UNK12",
		"UNK13",
		"UNK14",
		"UNK15",
	};
	for (i = 0; i < 16; i++)
		if (info->feature & 1 << i)
			fprintf(out, " %s", featurenames[i]);
	if (!info->feature)
		fprintf(out, " (none)");
	fprintf(out, ", unk07");
	for (i = 0; i < 6; i++)
		fprintf(out, " 0x%02x", info->unk07[i]);
	int unk19_st = 0;
	for (i = 0; i < 8; i++)
		if (info->unk19[i])
			unk19_st = 1;
	if (unk19_st) {
		fprintf(out, ", unk19");
		for (i = 0; i < 8; i++)
			fprintf(out, " 0x%02x", info->unk19[i]);
	}
	if (info->unk23)
		fprintf(out, ", unk23 0x%02x", info->unk23);
	if (info->unk24)
		fprintf(out, ", unk24 0x%02x", info->unk24);
	if (info->unk25)
		fprintf(out, ", unk25 0x%02x", info->unk25);
	if (info->unk26)
		fprintf(out, ", unk26 0x%04x", info->unk26);
	int unk28_st = 0;
	for (i = 0; i < 8; i++)
		if (info->unk28[i])
			unk28_st = 1;
	if (unk28_st) {
		fprintf(out, ", unk28");
		for (i = 0; i < 8; i++)
			fprintf(out, " 0x%02x", info->unk28[i]);
	}
	if (info->unk30[0]) {
		fprintf(out, ", unk30 %s", info->unk30);
		/* umm wtf? */
		if (!info->unk30[3])
			fprintf(out, " %s", info->unk30+4);
	}
	int unk3c_st = 0;
	for (i = 0; i < 8; i++)
		if (info->unk3c[i])
			unk3c_st = 1;
	if (unk3c_st) {
		fprintf(out, ", unk3c");
		for (i = 0; i < 8; i++)
			fprintf(out, " 0x%02x", info->unk3c[i]);
	}
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, info->bit->t_offset, info->bit->t_len, mask);
	fprintf(out, "\n");
}